

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O3

void workspace_destroy(workspace *workspace)

{
  list *list;
  node *pnVar1;
  
  list = workspace->clients;
  if (list != (list *)0x0) {
    pnVar1 = list->head;
    if (pnVar1 != (node *)0x0) {
      do {
        client_destroy((client *)pnVar1->data);
        pnVar1 = pnVar1->next;
      } while (pnVar1 != (node *)0x0);
      list = workspace->clients;
    }
    list_destroy(list);
  }
  free(workspace);
  return;
}

Assistant:

void workspace_destroy(struct workspace *workspace)
{
        if (workspace->clients != NULL) {
                LIST_FOR_EACH(workspace->clients, node)
                {
                        struct client *client = get_client_from_client_node(node);

                        client_destroy(client);
                }

                list_destroy(workspace->clients);
        }

        free(workspace);
}